

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

QRect __thiscall
QPixmapStyle::subElementRect
          (QPixmapStyle *this,SubElement element,QStyleOption *option,QWidget *widget)

{
  long lVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  Representation RVar5;
  Representation RVar6;
  QRect QVar7;
  ControlDescriptor local_74;
  QPixmapStyleDescriptor local_70;
  undefined1 local_38 [16];
  long local_28;
  undefined8 uVar8;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (element == SE_LineEditContents) {
    lVar1 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = (undefined1  [16])
               QCommonStyle::subElementRect
                         (&this->super_QCommonStyle,SE_LineEditContents,option,widget);
    local_74 = LE_Enabled;
    QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
              (&local_70,
               (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)(lVar1 + 0xe8),
               &local_74);
    auVar3 = local_38;
    RVar5.m_i = local_38._0_4_;
    RVar6.m_i = local_38._4_4_;
    local_38._4_4_ = RVar6.m_i + local_70.margins.m_top.m_i;
    local_38._0_4_ = RVar5.m_i + local_70.margins.m_left.m_i;
    auVar2._4_8_ = auVar3._8_8_;
    auVar2._0_4_ = RVar6.m_i - local_70.margins.m_top.m_i;
    auVar4._0_8_ = auVar2._0_8_ << 0x20;
    auVar4._8_4_ = auVar3._8_4_ - local_70.margins.m_right.m_i;
    auVar4._12_4_ = auVar3._12_4_ - local_70.margins.m_bottom.m_i;
    local_38._8_8_ = auVar4._8_8_;
    local_38 = (undefined1  [16])
               QStyle::visualRect(option->direction,&option->rect,(QRect *)local_38);
    if (&(local_70.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_70.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_70.fileName.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    local_38 = (undefined1  [16])
               QCommonStyle::subElementRect(&this->super_QCommonStyle,element,option,widget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar7.x1.m_i = local_38._0_4_;
    QVar7.y1.m_i = local_38._4_4_;
    register0x00000010 = local_38._8_4_;
    register0x00000014 = local_38._12_4_;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPixmapStyle::subElementRect(SubElement element, const QStyleOption *option,
                                   const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    switch (element) {
    case SE_LineEditContents:
    {
        QRect rect = QCommonStyle::subElementRect(element, option, widget);
        const QPixmapStyleDescriptor &desc = d->descriptors.value(LE_Enabled);
        rect.adjust(desc.margins.left(), desc.margins.top(),
                    -desc.margins.right(), -desc.margins.bottom());
        rect = visualRect(option->direction, option->rect, rect);
        return rect;
    }
    default: ;
    }

    return QCommonStyle::subElementRect(element, option, widget);
}